

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppleII.cpp
# Opt level: O1

unique_ptr<Reflection::Struct,_std::default_delete<Reflection::Struct>_> __thiscall
Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)0,_true>::get_options
          (ConcreteMachine<(Analyser::Static::AppleII::Target::Model)0,_true> *this)

{
  bool bVar1;
  Display DVar2;
  Options *this_00;
  Display DVar3;
  long in_RSI;
  
  this_00 = (Options *)operator_new(0x10);
  II::Machine::Options::Options(this_00,UserFriendly);
  DVar2 = (**(code **)(*(long *)(in_RSI + 0x28) + 0x20))(in_RSI + 0x28);
  DVar3 = RGB;
  if (DVar2 - SVideo < 3) {
    DVar3 = DVar2;
  }
  (this_00->super_DisplayOption<Apple::II::Machine::Options>).output = DVar3;
  bVar1 = II::Video::VideoBase::get_use_square_pixels((VideoBase *)(in_RSI + 0xdd0));
  this_00->use_square_pixels = bVar1;
  (this->super_Machine)._vptr_Machine = (_func_int **)this_00;
  return (__uniq_ptr_data<Reflection::Struct,_std::default_delete<Reflection::Struct>,_true,_true>)
         (__uniq_ptr_data<Reflection::Struct,_std::default_delete<Reflection::Struct>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<Reflection::Struct> get_options() final {
			auto options = std::make_unique<Options>(Configurable::OptionsType::UserFriendly);
			options->output = get_video_signal_configurable();
			options->use_square_pixels = video_.get_use_square_pixels();
			return options;
		}